

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O0

void __thiscall xmrig::Api::onConfigChanged(Api *this,Config *config,Config *previousConfig)

{
  bool bVar1;
  Api *this_00;
  String *this_01;
  BaseConfig *in_RDX;
  BaseConfig *in_RSI;
  String *in_RDI;
  String *in_stack_000000d8;
  Api *in_stack_000000e0;
  String *in_stack_ffffffffffffffc8;
  String *in_stack_ffffffffffffffd0;
  
  this_00 = (Api *)BaseConfig::apiId(in_RSI);
  BaseConfig::apiId(in_RDX);
  bVar1 = String::operator!=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (bVar1) {
    BaseConfig::apiId(in_RSI);
    genId(in_stack_000000e0,in_stack_000000d8);
  }
  this_01 = BaseConfig::apiWorkerId(in_RSI);
  BaseConfig::apiWorkerId(in_RDX);
  bVar1 = String::operator!=(this_01,in_stack_ffffffffffffffc8);
  if (bVar1) {
    BaseConfig::apiWorkerId(in_RSI);
    genWorkerId(this_00,in_RDI);
  }
  return;
}

Assistant:

void xmrig::Api::onConfigChanged(Config *config, Config *previousConfig)
{
    if (config->apiId() != previousConfig->apiId()) {
        genId(config->apiId());
    }

    if (config->apiWorkerId() != previousConfig->apiWorkerId()) {
        genWorkerId(config->apiWorkerId());
    }
}